

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmMakefile *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  cmLinkImplementationLibraries *this_01;
  string *in_base;
  cmGlobalGenerator *this_02;
  FrameworkDescriptor *this_03;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  bool local_4b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  cmListFileBacktrace local_448;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_438;
  undefined1 local_430;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_428;
  undefined1 local_420;
  undefined1 local_418 [8];
  string fwInclude;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  undefined1 local_350 [8];
  string libDir;
  cmLinkImplItem *lib;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range3;
  cmLinkImplementationLibraries *impl;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  cmValue local_298;
  cmValue val;
  allocator<char> local_259;
  undefined1 local_258 [8];
  string propertyName;
  string local_230;
  undefined1 local_210 [8];
  EvaluatedTargetPropertyEntries entries;
  undefined1 local_1e8 [5];
  bool debugIncludes;
  cmValue local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  iterator local_198;
  size_type local_190;
  undefined1 local_188 [8];
  cmList debugProperties;
  string local_168;
  undefined1 local_148 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  _Self local_88 [3];
  _Self local_70;
  iterator it;
  ConfigAndLanguage cacheKey;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *includes;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&it,config,lang);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
       ::find(&this->IncludeDirectoriesCache,
              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&it);
  local_88[0]._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
       ::end(&this->IncludeDirectoriesCache);
  bVar1 = std::operator!=(&local_70,local_88);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator->(&local_70);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(__return_storage_ptr__);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dagChecker.CheckResult);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"INCLUDE_DIRECTORIES",
               (allocator<char> *)
               ((long)&debugProperties.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_148,this,&local_168,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&debugProperties.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    entries._30_1_ = 1;
    local_1c0 = &local_1b8;
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"CMAKE_DEBUG_TARGET_PROPERTIES",
               (allocator<char> *)&entries.field_0x1f);
    local_1c8 = cmMakefile::GetDefinition(this_00,(string *)local_1e8);
    psVar3 = cmValue::operator_cast_to_string_(&local_1c8);
    std::__cxx11::string::string((string *)&local_1b8,(string *)psVar3);
    entries._30_1_ = 0;
    local_198 = &local_1b8;
    local_190 = 1;
    init._M_len = 1;
    init._M_array = local_198;
    cmList::cmList((cmList *)local_188,init);
    local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198;
    do {
      local_4a8 = local_4a8 + -1;
      std::__cxx11::string::~string((string *)local_4a8);
    } while (local_4a8 != &local_1b8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&entries.field_0x1f);
    local_4b9 = false;
    if ((this->DebugIncludesDone & 1U) == 0) {
      local_4b9 = ::cm::contains<cmList,_char[20],_0>((cmList *)local_188,(char (*) [20])0x1236ea9);
    }
    entries._29_1_ = local_4b9;
    bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
    if (bVar1) {
      this->DebugIncludesDone = true;
    }
    EvaluateTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_210,this,config,lang,
               (cmGeneratorExpressionDAGChecker *)local_148,&this->IncludeDirectoriesEntries);
    bVar1 = std::operator==(lang,"Swift");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"Swift_MODULE_DIRECTORY",
                 (allocator<char> *)(propertyName.field_2._M_local_buf + 0xf));
      anon_unknown.dwarf_18b9daa::AddLangSpecificImplicitIncludeDirectories
                (this,lang,config,&local_230,BINARY,(EvaluatedTargetPropertyEntries *)local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)(propertyName.field_2._M_local_buf + 0xf))
      ;
    }
    bVar1 = CanCompileSources(this);
    if (((bVar1) && (bVar1 = std::operator!=(lang,"Swift"), bVar1)) &&
       (bVar1 = std::operator!=(lang,"Fortran"), bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_258,"ISPC_HEADER_DIRECTORY",&local_259);
      std::allocator<char>::~allocator(&local_259);
      GetAllConfigCompileLanguages_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&val,this);
      bVar1 = ::cm::
              contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                        ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&val,(char (*) [5])"ISPC");
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&val);
      if (bVar1) {
        local_298 = GetProperty(this,(string *)local_258);
        bVar1 = cmValue::operator_cast_to_bool(&local_298);
        if (bVar1) {
          psVar3 = cmValue::operator*[abi_cxx11_(&local_298);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,psVar3);
        }
        else {
          GetObjectDirectory(&local_2b8,this,config);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"ISPC",&local_2d9);
      anon_unknown.dwarf_18b9daa::AddLangSpecificImplicitIncludeDirectories
                (this,&local_2d8,config,(string *)local_258,OBJECT,
                 (EvaluatedTargetPropertyEntries *)local_210);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      std::__cxx11::string::~string((string *)local_258);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"INTERFACE_INCLUDE_DIRECTORIES",
               (allocator<char> *)((long)&impl + 7));
    AddInterfaceEntries(this,config,&local_300,lang,(cmGeneratorExpressionDAGChecker *)local_148,
                        (EvaluatedTargetPropertyEntries *)local_210,Yes,Usage);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
    anon_unknown.dwarf_18b9daa::processIncludeDirectories
              (this,(EvaluatedTargetPropertyEntries *)local_210,__return_storage_ptr__,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dagChecker.CheckResult,(bool)(entries._29_1_ & 1));
    bVar1 = IsApple(this);
    if ((bVar1) &&
       (this_01 = GetLinkImplementationLibraries(this,config,Usage),
       this_01 != (cmLinkImplementationLibraries *)0x0)) {
      __end3 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                         (&this_01->Libraries);
      lib = (cmLinkImplItem *)
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this_01->Libraries);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                         *)&lib), bVar1) {
        libDir.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&__end3);
        std::__cxx11::string::string((string *)local_350);
        if (*(long *)(libDir.field_2._8_8_ + 0x20) == 0) {
          psVar3 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)libDir.field_2._8_8_);
          in_base = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
          cmsys::SystemTools::CollapseFullPath
                    ((string *)
                     &fwDescriptor.
                      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
                      _M_payload.
                      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
                      .super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>.
                      _M_engaged,psVar3,in_base);
          std::__cxx11::string::operator=
                    ((string *)local_350,
                     (string *)
                     &fwDescriptor.
                      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
                      _M_payload.
                      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
                      .super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>.
                      _M_engaged);
          std::__cxx11::string::~string
                    ((string *)
                     &fwDescriptor.
                      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
                      _M_payload.
                      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
                      .super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>.
                      _M_engaged);
LAB_00b04888:
          this_02 = GetGlobalGenerator(this);
          cmGlobalGenerator::SplitFrameworkPath
                    ((optional<cmGlobalGenerator::FrameworkDescriptor> *)
                     ((long)&fwInclude.field_2 + 8),this_02,(string *)local_350,Relaxed);
          bVar1 = std::optional::operator_cast_to_bool
                            ((optional *)(fwInclude.field_2._M_local_buf + 8));
          if (bVar1) {
            this_03 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                                ((optional<cmGlobalGenerator::FrameworkDescriptor> *)
                                 ((long)&fwInclude.field_2 + 8));
            cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
                      ((string *)local_418,this_03);
            pVar4 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&dagChecker.CheckResult,(value_type *)local_418);
            local_438._M_cur =
                 (__node_type *)
                 pVar4.first.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur;
            local_430 = pVar4.second;
            local_428._M_cur = local_438._M_cur;
            local_420 = local_430;
            if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_448.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              local_448.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cmListFileBacktrace::cmListFileBacktrace(&local_448);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_418,&local_448);
              cmListFileBacktrace::~cmListFileBacktrace(&local_448);
            }
            std::__cxx11::string::~string((string *)local_418);
          }
          std::optional<cmGlobalGenerator::FrameworkDescriptor>::~optional
                    ((optional<cmGlobalGenerator::FrameworkDescriptor> *)
                     ((long)&fwInclude.field_2 + 8));
        }
        else {
          bVar1 = cmTarget::IsFrameworkOnApple
                            ((cmTarget *)**(undefined8 **)(libDir.field_2._8_8_ + 0x20));
          if ((bVar1) || (bVar1 = IsImportedFrameworkFolderOnApple(this,config), bVar1)) {
            psVar3 = GetLocation(*(cmGeneratorTarget **)(libDir.field_2._8_8_ + 0x20),config);
            std::__cxx11::string::operator=((string *)local_350,(string *)psVar3);
            goto LAB_00b04888;
          }
        }
        std::__cxx11::string::~string((string *)local_350);
        __gnu_cxx::
        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    map<std::pair<std::__cxx11::string,std::__cxx11::string>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
    ::
    emplace<std::pair<std::__cxx11::string,std::__cxx11::string>&,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&>
              ((map<std::pair<std::__cxx11::string,std::__cxx11::string>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                *)&this->IncludeDirectoriesCache,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&it,__return_storage_ptr__);
    EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_210);
    cmList::~cmList((cmList *)local_188);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_148);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dagChecker.CheckResult);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  ConfigAndLanguage cacheKey(config, lang);
  {
    auto it = this->IncludeDirectoriesCache.find(cacheKey);
    if (it != this->IncludeDirectoriesCache.end()) {
      return it->second;
    }
  }
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  if (this->IsApple()) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir;
        if (lib.Target == nullptr) {
          libDir = cmSystemTools::CollapseFullPath(
            lib.AsStr(), this->Makefile->GetHomeOutputDirectory());
        } else if (lib.Target->Target->IsFrameworkOnApple() ||
                   this->IsImportedFrameworkFolderOnApple(config)) {
          libDir = lib.Target->GetLocation(config);
        } else {
          continue;
        }

        auto fwDescriptor =
          this->GetGlobalGenerator()->SplitFrameworkPath(libDir);
        if (!fwDescriptor) {
          continue;
        }

        auto fwInclude = fwDescriptor->GetFrameworkPath();
        if (uniqueIncludes.insert(fwInclude).second) {
          includes.emplace_back(fwInclude, cmListFileBacktrace());
        }
      }
    }
  }

  this->IncludeDirectoriesCache.emplace(cacheKey, includes);
  return includes;
}